

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

void __thiscall leveldb::anon_unknown_0::ShardedLRUCache::Prune(ShardedLRUCache *this)

{
  int iVar1;
  LRUHandle *pLVar2;
  long lVar3;
  Mutex *__mutex;
  LRUCache *this_00;
  
  lVar3 = 0;
  do {
    __mutex = &this->shard_[lVar3].mutex_;
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    this_00 = this->shard_ + lVar3;
    pLVar2 = (this_00->lru_).next;
    if (pLVar2 != &this_00->lru_) {
      do {
        pLVar2 = HandleTable::Remove(&this_00->table_,(Slice *)pLVar2->key_data,
                                     (uint32_t)pLVar2->key_length);
        LRUCache::FinishErase(this_00,pLVar2);
        pLVar2 = (this_00->lru_).next;
      } while (pLVar2 != &this_00->lru_);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  return;
}

Assistant:

void Prune() override {
    for (int s = 0; s < kNumShards; s++) {
      shard_[s].Prune();
    }
  }